

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::on_midiRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  bool bVar2;
  int iVar3;
  Master *this_00;
  QSettings *pQVar4;
  QString local_128;
  QDir local_110 [8];
  QString local_108;
  Int local_ec;
  QString local_e8;
  QString local_d0;
  undefined1 local_b8 [8];
  QString fileName;
  QString local_80;
  QVariant local_68;
  QFlag local_44;
  QFlags<QFileDialog::Option> local_40 [2];
  Options qFileDialogOptions;
  QString local_30;
  byte local_11;
  SynthWidget *pSStack_10;
  bool isMidiDataRecorded;
  SynthWidget *this_local;
  
  pSStack_10 = this;
  bVar2 = SynthRoute::isRecordingMidi(this->synthRoute);
  if (bVar2) {
    local_11 = SynthRoute::stopRecordingMidi(this->synthRoute);
    pQVar1 = (this->ui->super_Ui_SynthWidget).midiRecord;
    QString::QString(&local_30,"Record");
    QAbstractButton::setText((QString *)pQVar1);
    QString::~QString(&local_30);
    if ((local_11 & 1) != 0) {
      if ((on_midiRecord_clicked()::currentDir == '\0') &&
         (iVar3 = __cxa_guard_acquire(&on_midiRecord_clicked()::currentDir), iVar3 != 0)) {
        QString::QString(&on_midiRecord_clicked::currentDir,(char *)0x0);
        __cxa_atexit(QString::~QString,&on_midiRecord_clicked::currentDir,&__dso_handle);
        __cxa_guard_release(&on_midiRecord_clicked()::currentDir);
      }
      this_00 = Master::getInstance();
      pQVar4 = Master::getSettings(this_00);
      QString::QString(&local_80,"Master/qFileDialogOptions");
      QVariant::QVariant((QVariant *)&fileName.d.size,0);
      QSettings::value((QString *)&local_68,(QVariant *)pQVar4);
      iVar3 = QVariant::toInt((bool *)&local_68);
      QFlag::QFlag(&local_44,iVar3);
      QFlags<QFileDialog::Option>::QFlags(local_40,local_44);
      QVariant::~QVariant(&local_68);
      QVariant::~QVariant((QVariant *)&fileName.d.size);
      QString::~QString(&local_80);
      QString::QString(&local_d0,(char *)0x0);
      QString::QString(&local_e8,"Standard MIDI files (*.mid)");
      local_ec = local_40[0].i;
      QFileDialog::getSaveFileName
                ((QWidget *)local_b8,(QString *)this,(QString *)&local_d0,
                 (QString *)&on_midiRecord_clicked::currentDir,(QString *)&local_e8,
                 (QFlags_conflict1 *)0x0);
      QString::~QString(&local_e8);
      QString::~QString(&local_d0);
      bVar2 = QString::isEmpty((QString *)local_b8);
      if (!bVar2) {
        QDir::QDir(local_110,(QString *)local_b8);
        QDir::absolutePath();
        QString::operator=(&on_midiRecord_clicked::currentDir,&local_108);
        QString::~QString(&local_108);
        QDir::~QDir(local_110);
      }
      SynthRoute::saveRecordedMidi(this->synthRoute,(QString *)local_b8,1000000);
      QString::~QString((QString *)local_b8);
    }
  }
  else {
    pQVar1 = (this->ui->super_Ui_SynthWidget).midiRecord;
    QString::QString(&local_128,"Stop");
    QAbstractButton::setText((QString *)pQVar1);
    QString::~QString(&local_128);
    SynthRoute::startRecordingMidi(this->synthRoute);
  }
  return;
}

Assistant:

void SynthWidget::on_midiRecord_clicked() {
	if (synthRoute->isRecordingMidi()) {
		bool isMidiDataRecorded = synthRoute->stopRecordingMidi();
		ui->midiRecord->setText("Record");
		if (isMidiDataRecorded) {
			static QString currentDir = NULL;
			QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
			QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "Standard MIDI files (*.mid)",
				NULL, qFileDialogOptions);
			if (!fileName.isEmpty()) currentDir = QDir(fileName).absolutePath();
			synthRoute->saveRecordedMidi(fileName, MasterClock::NANOS_PER_MILLISECOND);
		}
	} else {
		ui->midiRecord->setText("Stop");
		synthRoute->startRecordingMidi();
	}
}